

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrect.cpp
# Opt level: O0

QRectF * __thiscall QRectF::operator&(QRectF *this,QRectF *r)

{
  double *pdVar1;
  double *in_RDX;
  double *in_RSI;
  QRectF *in_RDI;
  long in_FS_OFFSET;
  qreal b2;
  qreal t2;
  qreal b1;
  qreal t1;
  qreal r2;
  qreal l2;
  qreal r1;
  qreal l1;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  double local_18;
  double local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = *in_RSI;
  local_18 = *in_RSI;
  if (0.0 < in_RSI[2] || in_RSI[2] == 0.0) {
    local_18 = in_RSI[2] + local_18;
  }
  else {
    local_10 = in_RSI[2] + local_10;
  }
  if ((local_10 != local_18) || (NAN(local_10) || NAN(local_18))) {
    local_20 = *in_RDX;
    local_28 = *in_RDX;
    if (0.0 < in_RDX[2] || in_RDX[2] == 0.0) {
      local_28 = in_RDX[2] + local_28;
    }
    else {
      local_20 = in_RDX[2] + local_20;
    }
    if ((local_20 != local_28) || (NAN(local_20) || NAN(local_28))) {
      if ((local_28 <= local_10) || (local_18 <= local_20)) {
        QRectF(in_RDI);
      }
      else {
        local_30 = in_RSI[1];
        local_38 = in_RSI[1];
        if (0.0 < in_RSI[3] || in_RSI[3] == 0.0) {
          local_38 = in_RSI[3] + local_38;
        }
        else {
          local_30 = in_RSI[3] + local_30;
        }
        if ((local_30 != local_38) || (NAN(local_30) || NAN(local_38))) {
          local_40 = in_RDX[1];
          local_48 = in_RDX[1];
          if (0.0 < in_RDX[3] || in_RDX[3] == 0.0) {
            local_48 = in_RDX[3] + local_48;
          }
          else {
            local_40 = in_RDX[3] + local_40;
          }
          if ((local_40 != local_48) || (NAN(local_40) || NAN(local_48))) {
            if ((local_48 <= local_30) || (local_38 <= local_40)) {
              QRectF(in_RDI);
            }
            else {
              in_RDI->w = -NAN;
              in_RDI->h = -NAN;
              in_RDI->xp = -NAN;
              in_RDI->yp = -NAN;
              QRectF(in_RDI);
              pdVar1 = qMax<double>(&local_10,&local_20);
              in_RDI->xp = *pdVar1;
              pdVar1 = qMax<double>(&local_30,&local_40);
              in_RDI->yp = *pdVar1;
              pdVar1 = qMin<double>(&local_18,&local_28);
              in_RDI->w = *pdVar1 - in_RDI->xp;
              pdVar1 = qMin<double>(&local_38,&local_48);
              in_RDI->h = *pdVar1 - in_RDI->yp;
            }
          }
          else {
            QRectF(in_RDI);
          }
        }
        else {
          QRectF(in_RDI);
        }
      }
    }
    else {
      QRectF(in_RDI);
    }
  }
  else {
    QRectF(in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QRectF QRectF::operator&(const QRectF &r) const noexcept
{
    qreal l1 = xp;
    qreal r1 = xp;
    if (w < 0)
        l1 += w;
    else
        r1 += w;
    if (l1 == r1) // null rect
        return QRectF();

    qreal l2 = r.xp;
    qreal r2 = r.xp;
    if (r.w < 0)
        l2 += r.w;
    else
        r2 += r.w;
    if (l2 == r2) // null rect
        return QRectF();

    if (l1 >= r2 || l2 >= r1)
        return QRectF();

    qreal t1 = yp;
    qreal b1 = yp;
    if (h < 0)
        t1 += h;
    else
        b1 += h;
    if (t1 == b1) // null rect
        return QRectF();

    qreal t2 = r.yp;
    qreal b2 = r.yp;
    if (r.h < 0)
        t2 += r.h;
    else
        b2 += r.h;
    if (t2 == b2) // null rect
        return QRectF();

    if (t1 >= b2 || t2 >= b1)
        return QRectF();

    QRectF tmp;
    tmp.xp = qMax(l1, l2);
    tmp.yp = qMax(t1, t2);
    tmp.w = qMin(r1, r2) - tmp.xp;
    tmp.h = qMin(b1, b2) - tmp.yp;
    return tmp;
}